

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O3

String * kj::_::operator*(String *__return_storage_ptr__,long param_2,undefined8 param_3,
                         undefined8 param_4,CappedArray<char,_14UL> *param_5)

{
  char *local_48;
  undefined8 local_40;
  CappedArray<char,_14UL> local_38;
  
  local_48 = "(can\'t stringify)";
  local_40 = 0x12;
  Stringifier::operator*(&local_38,(Stringifier *)&STR,*(uint *)(param_2 + 4));
  concat<kj::StringPtr,kj::StringPtr&,kj::CappedArray<char,14ul>>
            (__return_storage_ptr__,(_ *)&local_48,(StringPtr *)(param_2 + 8),(StringPtr *)&local_38
             ,param_5);
  return __return_storage_ptr__;
}

Assistant:

String KJ_STRINGIFY(DebugComparison<Left, Right>& cmp) {
  return _::concat(tryToCharSequence(&cmp.left), cmp.op, tryToCharSequence(&cmp.right));
}